

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

int main(int argc,char **argv)

{
  psocks_state *ps_00;
  psocks_state *ps;
  char **argv_local;
  int argc_local;
  
  ps_00 = psocks_new(&platform);
  psocks_cmdline(ps_00,argc,argv);
  sk_init();
  uxsel_init();
  psocks_start(ps_00);
  cli_main_loop(psocks_pw_setup,psocks_pw_check,psocks_continue,(void *)0x0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    psocks_state *ps = psocks_new(&platform);
    psocks_cmdline(ps, argc, argv);

    sk_init();
    uxsel_init();
    psocks_start(ps);

    cli_main_loop(psocks_pw_setup, psocks_pw_check, psocks_continue, NULL);
}